

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O3

void multipredict(nn *n,single_learner *base,example *ec,size_t count,size_t step,
                 polyprediction *pred,bool finalize_predictions)

{
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  uint64_t uVar4;
  size_t sVar5;
  
  if (count == 0) {
    uVar4 = (ec->super_example_predict).ft_offset;
  }
  else {
    sVar5 = 0;
    do {
      if (sVar5 == 0) {
        predict_or_learn_multi<false,true>(n,base,ec);
      }
      else {
        predict_or_learn_multi<false,false>(n,base,ec);
      }
      if (finalize_predictions) {
        pfVar1 = (ec->pred).scalars._begin;
        pfVar2 = (ec->pred).scalars._end;
        sVar3 = (ec->pred).scalars.erase_count;
        (pred->scalars).end_array = (ec->pred).scalars.end_array;
        (pred->scalars).erase_count = sVar3;
        (pred->scalars)._begin = pfVar1;
        (pred->scalars)._end = pfVar2;
      }
      else {
        pred->scalar = ec->partial_prediction;
      }
      uVar4 = (ec->super_example_predict).ft_offset + step;
      (ec->super_example_predict).ft_offset = uVar4;
      sVar5 = sVar5 + 1;
      pred = pred + 1;
    } while (count != sVar5);
  }
  (ec->super_example_predict).ft_offset = uVar4 - step * count;
  return;
}

Assistant:

void multipredict(nn& n, single_learner& base, example& ec, size_t count, size_t step, polyprediction* pred,
    bool finalize_predictions)
{
  for (size_t c = 0; c < count; c++)
  {
    if (c == 0)
      predict_or_learn_multi<false, true>(n, base, ec);
    else
      predict_or_learn_multi<false, false>(n, base, ec);
    if (finalize_predictions)
      pred[c] = ec.pred;
    else
      pred[c].scalar = ec.partial_prediction;
    ec.ft_offset += (uint64_t)step;
  }
  ec.ft_offset -= (uint64_t)(step * count);
}